

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3Fts5IndexQuery
              (Fts5Index *p,char *pToken,int nToken,int flags,Fts5Colset *pColset,
              Fts5IndexIter **ppIter)

{
  int *pRc;
  Fts5Buffer *pRight;
  int *piVar1;
  size_t __n;
  byte *pbVar2;
  u8 **ppuVar3;
  ushort uVar4;
  u32 uVar5;
  Fts5Data *pFVar6;
  u8 *puVar7;
  Fts5TombstoneArray *pFVar8;
  u8 *pToken_00;
  undefined1 pTerm [8];
  byte bVar9;
  int nChar;
  int iVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  Fts5Structure *pFVar14;
  Fts5Iter *pFVar15;
  char *zSql;
  ulong uVar16;
  Fts5TokenDataIter *__s;
  Fts5Config *pFVar17;
  undefined8 *p_00;
  Fts5Iter *pFVar18;
  int iVar19;
  long lVar20;
  long lVar21;
  u32 nByte;
  int iVar22;
  Fts5SegIter *pIter;
  ulong uVar23;
  sqlite3_int64 nByte_00;
  ulong uVar24;
  Fts5SegIter *__src;
  long lVar25;
  int ii;
  Fts5StructureSegment *pSeg;
  Fts5Data **ppFVar26;
  long in_FS_OFFSET;
  Fts5Buffer *local_150;
  Fts5TokenDataIter *local_140;
  sqlite3_stmt *local_128;
  int local_e8;
  Fts5Buffer buf;
  Fts5Iter *local_a0;
  Fts5TokenDataIter *local_98;
  undefined8 uStack_90;
  undefined1 local_88 [8];
  code *pcStack_80;
  undefined8 local_78;
  ulong local_70;
  void *pvStack_68;
  undefined8 local_60;
  Fts5Buffer FStack_58;
  Fts5TokenDataIter **ppFStack_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pFVar17 = p->pConfig;
  local_a0 = (Fts5Iter *)0x0;
  buf.p = (u8 *)0x0;
  buf.n = 0;
  buf.nSpace = 0;
  pRc = &p->rc;
  __n = (long)nToken + 1;
  nByte = (u32)__n;
  iVar10 = sqlite3Fts5BufferSize(pRc,&buf,nByte);
  if (iVar10 != 0) goto LAB_001c8437;
  iVar10 = pFVar17->bTokendata;
  if (0 < nToken) {
    memcpy(buf.p + 1,pToken,(ulong)(uint)nToken);
  }
  pToken_00 = buf.p;
  if ((flags & 1U) == 0) {
    if (((flags & 0x88U) != 0) || (iVar10 == 0)) {
      uVar12 = pFVar17->nPrefix;
      iVar19 = 0;
      iVar22 = 0;
      goto LAB_001c7eaf;
    }
    *buf.p = '0';
    local_88 = (undefined1  [8])0x0;
    pcStack_80 = (code *)0x0;
    fts5IndexFlush(p);
    pFVar14 = fts5StructureRead(p);
    local_150 = (Fts5Buffer *)0x0;
    local_140 = (Fts5TokenDataIter *)0x0;
    while (*pRc == 0) {
      if (local_140 == (Fts5TokenDataIter *)0x0) {
        pFVar18 = (Fts5Iter *)0x0;
      }
      else {
        pFVar18 = local_140->apIter[(long)local_140->nIter + -1];
      }
      pFVar15 = fts5MultiIterAlloc(p,pFVar14->nSegment);
      if (local_150 == (Fts5Buffer *)0x0) {
        sqlite3Fts5BufferSet(pRc,(Fts5Buffer *)local_88,nByte,pToken_00);
      }
      else {
        sqlite3Fts5BufferSet(pRc,(Fts5Buffer *)local_88,local_150->n,local_150->p);
        sqlite3Fts5BufferAppendBlob(pRc,(Fts5Buffer *)local_88,1,(u8 *)"");
      }
      if (*pRc != 0) {
        fts5IterClose(&pFVar15->base);
        break;
      }
      pIter = pFVar15->aSeg;
      __src = pFVar18->aSeg;
      if (pFVar18 == (Fts5Iter *)0x0) {
        __src = (Fts5SegIter *)0x0;
      }
      for (lVar20 = 0; pTerm = local_88, lVar20 < pFVar14->nLevel; lVar20 = lVar20 + 1) {
        uVar12 = pFVar14->aLevel[lVar20].nSeg;
        iVar10 = (int)pcStack_80;
        iVar19 = (int)pcStack_80 + -1;
        iVar22 = uVar12 + 1;
        lVar21 = (ulong)uVar12 * 0x38;
        do {
          iVar22 = iVar22 + -1;
          if (iVar22 < 1) break;
          pSeg = (Fts5StructureSegment *)((long)&pFVar14->aLevel[lVar20].aSeg[-1].iSegid + lVar21);
          if (__src == (Fts5SegIter *)0x0) {
            fts5SegIterSeekInit(p,(u8 *)pTerm,iVar10,0x108,pSeg,pIter);
            fts5SegIterAllocTombstone(p,pIter);
          }
          else {
            iVar11 = fts5BufferCompare(local_150,&__src->term);
            if (iVar11 == 0) {
              if (__src->pLeaf->szLeaf < __src->iEndofDoclist) {
                local_128 = p->pIdxNextSelect;
                if (local_128 == (sqlite3_stmt *)0x0) {
                  uVar12 = 0;
                  zSql = sqlite3_mprintf("SELECT pgno FROM \'%q\'.\'%q_idx\' WHERE segid=? AND term>? ORDER BY term ASC LIMIT 1"
                                         ,p->pConfig->zDb,p->pConfig->zName);
                  fts5IndexPrepareStmt(p,&p->pIdxNextSelect,zSql);
                  local_128 = p->pIdxNextSelect;
                  local_e8 = -1;
                  if (local_128 != (sqlite3_stmt *)0x0) goto LAB_001c7ab5;
                }
                else {
LAB_001c7ab5:
                  sqlite3_bind_int(local_128,1,pSeg->iSegid);
                  sqlite3_bind_blob(local_128,2,(void *)pTerm,iVar19,(_func_void_void_ptr *)0x0);
                  iVar11 = sqlite3_step(local_128);
                  local_e8 = -1;
                  uVar12 = 0;
                  if (iVar11 == 100) {
                    uVar16 = sqlite3_column_int64(local_128,0);
                    local_e8 = (int)(uVar16 >> 1);
                    uVar12 = (uint)uVar16 & 1;
                  }
                  iVar11 = sqlite3_reset(local_128);
                  *pRc = iVar11;
                  sqlite3_bind_null(local_128,2);
                  if (*pRc != 0) goto LAB_001c7c36;
                }
                pIter->pSeg = (Fts5StructureSegment *)0x0;
                pIter->flags = 0;
                pIter->iLeafPgno = 0;
                pIter->iRowid = 0;
                pIter->nPos = 0;
                pIter->bDel = '\0';
                *(undefined3 *)&pIter->field_0x7d = 0;
                (pIter->term).p = (u8 *)0x0;
                (pIter->term).n = 0;
                (pIter->term).nSpace = 0;
                pIter->aRowidOffset = (int *)0x0;
                pIter->pDlidx = (Fts5DlidxIter *)0x0;
                pIter->iPgidxOff = 0;
                pIter->iEndofDoclist = 0;
                pIter->iRowidOffset = 0;
                pIter->nRowidOffset = 0;
                pIter->xNext = (_func_void_Fts5Index_ptr_Fts5SegIter_ptr_int_ptr *)0x0;
                pIter->iTermLeafPgno = 0;
                pIter->iTermLeafOffset = 0;
                pIter->iLeafOffset = 0;
                pIter->pTombArray = (Fts5TombstoneArray *)0x0;
                pIter->pLeaf = (Fts5Data *)0x0;
                pIter->pNextLeaf = (Fts5Data *)0x0;
                pIter->pSeg = pSeg;
                *(byte *)&pIter->flags = (byte)pIter->flags | 1;
                if (-1 < local_e8) {
                  pIter->iLeafPgno = local_e8 + -1;
                  fts5SegIterNextPage(p,pIter);
                  fts5SegIterSetNext(p,pIter);
                }
                pFVar6 = pIter->pLeaf;
                if (pFVar6 != (Fts5Data *)0x0) {
                  puVar7 = pFVar6->p;
                  local_98 = (Fts5TokenDataIter *)((ulong)local_98 & 0xffffffff00000000);
                  iVar11 = pFVar6->szLeaf;
                  pIter->iPgidxOff = iVar11;
                  iVar13 = sqlite3Fts5GetVarint32(puVar7 + iVar11,(u32 *)&local_98);
                  pIter->iPgidxOff = iVar13 + iVar11;
                  pIter->iLeafOffset = (long)(int)local_98;
                  fts5SegIterLoadTerm(p,pIter,0);
                  fts5SegIterLoadNPos(p,pIter);
                  if (uVar12 != 0) {
                    fts5SegIterLoadDlidx(p,pIter);
                  }
                }
              }
              else {
                fts5SegIterSeekInit(p,(u8 *)pTerm,iVar10,0x108,pSeg,pIter);
              }
            }
            else {
              memcpy(pIter,__src,0x80);
              __src->pSeg = (Fts5StructureSegment *)0x0;
              __src->flags = 0;
              __src->iLeafPgno = 0;
              __src->pLeaf = (Fts5Data *)0x0;
              __src->pNextLeaf = (Fts5Data *)0x0;
              __src->iLeafOffset = 0;
              __src->pTombArray = (Fts5TombstoneArray *)0x0;
              __src->xNext = (_func_void_Fts5Index_ptr_Fts5SegIter_ptr_int_ptr *)0x0;
              __src->iTermLeafPgno = 0;
              __src->iTermLeafOffset = 0;
              __src->iPgidxOff = 0;
              __src->iEndofDoclist = 0;
              __src->iRowidOffset = 0;
              __src->nRowidOffset = 0;
              __src->aRowidOffset = (int *)0x0;
              __src->pDlidx = (Fts5DlidxIter *)0x0;
              (__src->term).p = (u8 *)0x0;
              (__src->term).n = 0;
              (__src->term).nSpace = 0;
              __src->iRowid = 0;
              __src->nPos = 0;
              __src->bDel = '\0';
              *(undefined3 *)&__src->field_0x7d = 0;
            }
LAB_001c7c36:
            pFVar8 = __src->pTombArray;
            if (pFVar8 != (Fts5TombstoneArray *)0x0) {
              pIter->pTombArray = pFVar8;
              pFVar8->nRef = pFVar8->nRef + 1;
            }
          }
          pIter = pIter + 1;
          if (__src != (Fts5SegIter *)0x0) {
            __src = __src + 1;
          }
          lVar21 = lVar21 + -0x38;
        } while (*pRc == 0);
      }
      if ((pFVar18 != (Fts5Iter *)0x0) && (pFVar18->aSeg[0].pLeaf == (Fts5Data *)0x0)) {
        sqlite3Fts5BufferSet(&pFVar18->pIndex->rc,&pFVar18->aSeg[0].term,local_150->n,local_150->p);
      }
      pFVar15->bSkipEmpty = '\x01';
      pFVar15->pColset = pColset;
      fts5IterSetOutputCb(pRc,pFVar15);
      ppFVar26 = &pFVar15->aSeg[0].pLeaf;
      local_150 = (Fts5Buffer *)0x0;
      for (lVar20 = 0; lVar20 < pFVar15->nSeg; lVar20 = lVar20 + 1) {
        pRight = (Fts5Buffer *)(ppFVar26 + 10);
        uVar5 = *(u32 *)(ppFVar26 + 0xb);
        if (nToken < (int)uVar5) {
          puVar7 = pRight->p;
          iVar10 = bcmp(puVar7,pToken_00,__n);
          if ((iVar10 != 0) || ((uVar5 != nByte && (puVar7[__n] != '\0')))) goto LAB_001c7d1a;
        }
        else {
LAB_001c7d1a:
          sqlite3_free(*ppFVar26);
          *ppFVar26 = (Fts5Data *)0x0;
        }
        if ((*ppFVar26 != (Fts5Data *)0x0) &&
           ((local_150 == (Fts5Buffer *)0x0 ||
            (iVar10 = fts5BufferCompare(local_150,pRight), 0 < iVar10)))) {
          local_150 = pRight;
        }
        ppFVar26 = ppFVar26 + 0x10;
      }
      if (local_150 == (Fts5Buffer *)0x0) {
        fts5IterClose(&pFVar15->base);
        break;
      }
      if (*pRc == 0) {
        iVar10 = 0x10;
        if (local_140 == (Fts5TokenDataIter *)0x0) {
LAB_001c7db5:
          iVar19 = iVar10 * 8 + 0x40;
          __s = (Fts5TokenDataIter *)sqlite3_realloc(local_140,iVar19);
          if (__s == (Fts5TokenDataIter *)0x0) {
            *pRc = 7;
          }
          else {
            if (local_140 == (Fts5TokenDataIter *)0x0) {
              memset(__s,0,(long)iVar19);
            }
            __s->nIterAlloc = iVar10;
            local_140 = __s;
            if (*pRc == 0) {
              iVar10 = __s->nIter;
              goto LAB_001c7e18;
            }
          }
          goto LAB_001c7d7f;
        }
        iVar10 = local_140->nIter;
        if (iVar10 == local_140->nIterAlloc) {
          iVar10 = iVar10 * 2;
          goto LAB_001c7db5;
        }
LAB_001c7e18:
        local_140->nIter = iVar10 + 1;
        local_140->apIter[iVar10] = pFVar15;
      }
      else {
LAB_001c7d7f:
        fts5IterClose(&pFVar15->base);
      }
    }
    iVar10 = *pRc;
    if ((iVar10 == 0) && (local_140 != (Fts5TokenDataIter *)0x0)) {
      for (lVar20 = 0; lVar20 < local_140->nIter; lVar20 = lVar20 + 1) {
        pFVar18 = local_140->apIter[lVar20];
        uVar16 = (ulong)(uint)pFVar18->nSeg;
        if (pFVar18->nSeg < 1) {
          uVar16 = 0;
        }
        for (lVar21 = 0; uVar16 * 0x80 != lVar21; lVar21 = lVar21 + 0x80) {
          pbVar2 = (byte *)((long)&pFVar18->aSeg[0].flags + lVar21);
          *pbVar2 = *pbVar2 | 1;
        }
        fts5MultiIterFinishSetup(p,pFVar18);
      }
      iVar10 = *pRc;
    }
    if ((iVar10 == 0) && (pFVar18 = fts5MultiIterAlloc(p,0), pFVar18 != (Fts5Iter *)0x0)) {
      pFVar18->nSeg = 0;
      pFVar18->pTokenDataIter = local_140;
      if (local_140 == (Fts5TokenDataIter *)0x0) {
        (pFVar18->base).bEof = '\x01';
      }
      else {
        fts5IterSetOutputsTokendata(pFVar18);
      }
    }
    else {
      fts5TokendataIterDelete(local_140);
      pFVar18 = (Fts5Iter *)0x0;
    }
    fts5StructureRelease(pFVar14);
    sqlite3Fts5BufferFree((Fts5Buffer *)local_88);
    local_a0 = pFVar18;
LAB_001c83f9:
    pFVar18 = local_a0;
    if (*pRc != 0) goto LAB_001c8406;
  }
  else {
    iVar10 = 0;
    iVar19 = 0;
    while (iVar19 < nToken) {
      if ((byte)pToken[iVar19] < 0xc0) {
        iVar22 = iVar19 + 1;
      }
      else {
        iVar22 = nToken;
        if ((long)iVar19 + 1 < (long)nToken) {
          iVar22 = iVar19 + 1;
        }
      }
      iVar19 = iVar22;
      iVar10 = iVar10 + 1;
    }
    uVar12 = pFVar17->nPrefix;
    uVar16 = 0;
    uVar24 = 0;
    if (0 < (int)uVar12) {
      uVar24 = (ulong)uVar12;
    }
    iVar19 = (int)uVar24 + 1;
    uVar23 = 0;
    while (iVar22 = (int)uVar23, uVar24 != uVar16) {
      piVar1 = pFVar17->aPrefix + uVar16;
      if (*piVar1 == iVar10) {
        iVar19 = (int)uVar16 + 1;
        break;
      }
      uVar16 = uVar16 + 1;
      if (*piVar1 == iVar10 + 1) {
        uVar23 = uVar16 & 0xffffffff;
      }
    }
LAB_001c7eaf:
    if (iVar19 <= (int)uVar12) {
      pFVar14 = fts5StructureRead(p);
      *buf.p = (char)iVar19 + '0';
      if (pFVar14 != (Fts5Structure *)0x0) {
        fts5MultiIterNew(p,pFVar14,flags | 0x10,pColset,buf.p,nByte,-1,0,&local_a0);
        fts5StructureRelease(pFVar14);
      }
      goto LAB_001c83f9;
    }
    pvStack_68 = (void *)0x0;
    FStack_58.p = (u8 *)0x0;
    FStack_58.n = 0;
    FStack_58.nSpace = 0;
    ppFStack_48 = (Fts5TokenDataIter **)0x0;
    local_70 = 1;
    local_78 = 0;
    local_98 = (Fts5TokenDataIter *)0x0;
    uStack_90 = 0;
    local_60 = 0x20;
    pFVar17 = p->pConfig;
    if (((iVar22 == 0) && (pFVar17->eDetail == 0)) && (pFVar17->bPrefixInsttoken != 0)) {
      ppFStack_48 = &local_98;
      local_98 = (Fts5TokenDataIter *)sqlite3Fts5MallocZero(pRc,0x40);
      pFVar17 = p->pConfig;
    }
    if (pFVar17->eDetail == 1) {
      pcStack_80 = fts5AppendRowid;
      local_88 = (undefined1  [8])fts5MergeRowidLists;
      nByte_00 = 0x200;
    }
    else {
      local_70 = CONCAT44(local_70._4_4_,0xf);
      local_60 = CONCAT44(local_60._4_4_,0x78);
      pcStack_80 = fts5AppendPoslist;
      local_88 = (undefined1  [8])fts5MergePrefixLists;
      nByte_00 = 0x780;
    }
    pvStack_68 = sqlite3Fts5MallocZero(pRc,nByte_00);
    pFVar14 = fts5StructureRead(p);
    if (p->rc == 0) {
      if (iVar22 != 0) {
        *pToken_00 = '0';
        fts5VisitEntries(p,pColset,pToken_00,nByte,0,prefixIterSetupCb,local_88);
      }
      *pToken_00 = (char)iVar22 + '0';
      fts5VisitEntries(p,pColset,pToken_00,nByte,1,prefixIterSetupCb,local_88);
      lVar20 = 0;
      while( true ) {
        iVar10 = (int)lVar20;
        if ((int)local_60 <= iVar10) break;
        if (*pRc == 0) {
          (*(code *)local_88)(p,&FStack_58,local_70 & 0xffffffff,
                              (void *)((long)iVar10 * 0x10 + (long)pvStack_68));
        }
        lVar25 = (long)iVar10;
        lVar21 = lVar25 << 4;
        while( true ) {
          lVar20 = (long)(int)local_70 + (long)iVar10;
          if (lVar20 <= lVar25) break;
          sqlite3Fts5BufferFree((Fts5Buffer *)((long)pvStack_68 + lVar21));
          lVar25 = lVar25 + 1;
          lVar21 = lVar21 + 0x10;
        }
      }
      p_00 = (undefined8 *)sqlite3Fts5MallocZero(pRc,(long)FStack_58.n + 0x18);
      if (p_00 != (undefined8 *)0x0) {
        *p_00 = p_00 + 2;
        *(int *)((long)p_00 + 0xc) = FStack_58.n;
        *(int *)(p_00 + 1) = FStack_58.n;
        if ((long)FStack_58.n != 0) {
          memcpy(p_00 + 2,FStack_58.p,(long)FStack_58.n);
        }
        pFVar18 = fts5MultiIterAlloc(p,2);
        if (pFVar18 != (Fts5Iter *)0x0) {
          pFVar15 = pFVar18 + 1;
          *(undefined4 *)&pFVar18[1].base.pData = 1;
          if (*(int *)((long)p_00 + 0xc) < 1) {
            (pFVar18->base).bEof = '\x01';
          }
          else {
            *(undefined8 **)&pFVar18[1].base.nData = p_00;
            bVar9 = sqlite3Fts5GetVarint((uchar *)*p_00,(u64 *)&pFVar18[1].aSeg[0].flags);
            pFVar18[1].pIndex = (Fts5Index *)(ulong)bVar9;
            *(undefined4 *)((long)&pFVar18[1].xSetOutputs + 4) = *(undefined4 *)(p_00 + 1);
            pFVar18->aFirst[1].iFirst = 1;
            if ((flags & 2U) == 0) {
              fts5SegIterLoadNPos(p,(Fts5SegIter *)pFVar15);
            }
            else {
              pFVar18->bRev = 1;
              ppuVar3 = &pFVar18[1].base.pData;
              *(byte *)ppuVar3 = *(byte *)ppuVar3 | 2;
              fts5SegIterReverseInitPage(p,(Fts5SegIter *)pFVar15);
            }
            p_00 = (undefined8 *)0x0;
          }
          fts5SegIterSetNext(p,(Fts5SegIter *)pFVar15);
          local_a0 = pFVar18;
        }
        sqlite3_free(p_00);
      }
      pFVar18 = local_a0;
      if ((*pRc == 0) && (ppFStack_48 != (Fts5TokenDataIter **)0x0)) {
        fts5TokendataIterSortMap(p,local_98);
        local_a0->pTokenDataIter = local_98;
        local_98 = (Fts5TokenDataIter *)0x0;
        pFVar18 = local_a0;
      }
    }
    else {
      pFVar18 = (Fts5Iter *)0x0;
    }
    fts5TokendataIterDelete(local_98);
    sqlite3Fts5BufferFree(&FStack_58);
    fts5StructureRelease(pFVar14);
    sqlite3_free(pvStack_68);
    if (pFVar18 == (Fts5Iter *)0x0) goto LAB_001c83f9;
    fts5IterSetOutputCb(pRc,pFVar18);
    if (*pRc == 0) {
      uVar4 = pFVar18->aFirst[1].iFirst;
      if (pFVar18->aSeg[uVar4].pLeaf != (Fts5Data *)0x0) {
        (*pFVar18->xSetOutputs)(pFVar18,pFVar18->aSeg + uVar4);
      }
      goto LAB_001c83f9;
    }
LAB_001c8406:
    fts5IterClose(&pFVar18->base);
    fts5IndexCloseReader(p);
    pFVar18 = (Fts5Iter *)0x0;
  }
  *ppIter = &pFVar18->base;
  sqlite3Fts5BufferFree(&buf);
LAB_001c8437:
  iVar10 = *pRc;
  *pRc = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar10;
  }
  __stack_chk_fail();
}

Assistant:

static int sqlite3Fts5IndexQuery(
  Fts5Index *p,                   /* FTS index to query */
  const char *pToken, int nToken, /* Token (or prefix) to query for */
  int flags,                      /* Mask of FTS5INDEX_QUERY_X flags */
  Fts5Colset *pColset,            /* Match these columns only */
  Fts5IndexIter **ppIter          /* OUT: New iterator object */
){
  Fts5Config *pConfig = p->pConfig;
  Fts5Iter *pRet = 0;
  Fts5Buffer buf = {0, 0, 0};

  /* If the QUERY_SCAN flag is set, all other flags must be clear. */
  assert( (flags & FTS5INDEX_QUERY_SCAN)==0 || flags==FTS5INDEX_QUERY_SCAN );

  if( sqlite3Fts5BufferSize(&p->rc, &buf, nToken+1)==0 ){
    int iIdx = 0;                 /* Index to search */
    int iPrefixIdx = 0;           /* +1 prefix index */
    int bTokendata = pConfig->bTokendata;
    assert( buf.p!=0 );
    if( nToken>0 ) memcpy(&buf.p[1], pToken, nToken);

    /* The NOTOKENDATA flag is set when each token in a tokendata=1 table
    ** should be treated individually, instead of merging all those with
    ** a common prefix into a single entry. This is used, for example, by
    ** queries performed as part of an integrity-check, or by the fts5vocab
    ** module.  */
    if( flags & (FTS5INDEX_QUERY_NOTOKENDATA|FTS5INDEX_QUERY_SCAN) ){
      bTokendata = 0;
    }

    /* Figure out which index to search and set iIdx accordingly. If this
    ** is a prefix query for which there is no prefix index, set iIdx to
    ** greater than pConfig->nPrefix to indicate that the query will be
    ** satisfied by scanning multiple terms in the main index.
    **
    ** If the QUERY_TEST_NOIDX flag was specified, then this must be a
    ** prefix-query. Instead of using a prefix-index (if one exists),
    ** evaluate the prefix query using the main FTS index. This is used
    ** for internal sanity checking by the integrity-check in debug
    ** mode only.  */
#ifdef SQLITE_DEBUG
    if( pConfig->bPrefixIndex==0 || (flags & FTS5INDEX_QUERY_TEST_NOIDX) ){
      assert( flags & FTS5INDEX_QUERY_PREFIX );
      iIdx = 1+pConfig->nPrefix;
    }else
#endif
    if( flags & FTS5INDEX_QUERY_PREFIX ){
      int nChar = fts5IndexCharlen(pToken, nToken);
      for(iIdx=1; iIdx<=pConfig->nPrefix; iIdx++){
        int nIdxChar = pConfig->aPrefix[iIdx-1];
        if( nIdxChar==nChar ) break;
        if( nIdxChar==nChar+1 ) iPrefixIdx = iIdx;
      }
    }

    if( bTokendata && iIdx==0 ){
      buf.p[0] = FTS5_MAIN_PREFIX;
      pRet = fts5SetupTokendataIter(p, buf.p, nToken+1, pColset);
    }else if( iIdx<=pConfig->nPrefix ){
      /* Straight index lookup */
      Fts5Structure *pStruct = fts5StructureRead(p);
      buf.p[0] = (u8)(FTS5_MAIN_PREFIX + iIdx);
      if( pStruct ){
        fts5MultiIterNew(p, pStruct, flags | FTS5INDEX_QUERY_SKIPEMPTY,
            pColset, buf.p, nToken+1, -1, 0, &pRet
        );
        fts5StructureRelease(pStruct);
      }
    }else{
      /* Scan multiple terms in the main index for a prefix query. */
      int bDesc = (flags & FTS5INDEX_QUERY_DESC)!=0;
      fts5SetupPrefixIter(p, bDesc, iPrefixIdx, buf.p, nToken+1, pColset,&pRet);
      if( pRet==0 ){
        assert( p->rc!=SQLITE_OK );
      }else{
        assert( pRet->pColset==0 );
        fts5IterSetOutputCb(&p->rc, pRet);
        if( p->rc==SQLITE_OK ){
          Fts5SegIter *pSeg = &pRet->aSeg[pRet->aFirst[1].iFirst];
          if( pSeg->pLeaf ) pRet->xSetOutputs(pRet, pSeg);
        }
      }
    }

    if( p->rc ){
      fts5IterClose((Fts5IndexIter*)pRet);
      pRet = 0;
      fts5IndexCloseReader(p);
    }

    *ppIter = (Fts5IndexIter*)pRet;
    sqlite3Fts5BufferFree(&buf);
  }
  return fts5IndexReturn(p);
}